

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int __thiscall AActor::DoSpecialDamage(AActor *this,AActor *target,int damage,FName *damagetype)

{
  player_t *player;
  AActor *source;
  FName *damagetype_local;
  int damage_local;
  AActor *target_local;
  AActor *this_local;
  
  if ((((target->player == (player_t *)0x0) || (target->player->mo != (APlayerPawn *)target)) ||
      (999 < damage)) ||
     (((target->player->cheats & 2U) == 0 && ((target->player->cheats & 0x2000000U) == 0)))) {
    damagetype_local._4_4_ = damage;
    if ((target->player != (player_t *)0x0) &&
       ((0 < this->PoisonDamage && (this->PoisonDuration == -0x80000000)))) {
      player = target->player;
      source = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
      P_PoisonPlayer(player,this,source,this->PoisonDamage);
      damagetype_local._4_4_ = damage >> 1;
    }
    this_local._4_4_ = damagetype_local._4_4_;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int AActor::DoSpecialDamage (AActor *target, int damage, FName damagetype)
{
	if (target->player && target->player->mo == target && damage < 1000 &&
		(target->player->cheats & CF_GODMODE || target->player->cheats & CF_GODMODE2))
	{
		return -1;
	}
	else
	{
		if (target->player)
		{
			// Only do this for old style poison damage.
			if (PoisonDamage > 0 && PoisonDuration == INT_MIN)
			{
				P_PoisonPlayer (target->player, this, this->target, PoisonDamage);
				damage >>= 1;
			}
		}
	
		return damage;
	}
}